

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O0

int ReactionJac(sunrealtype c,N_Vector y,SUNMatrix Jac,UserData udata)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  char *funcname;
  long lVar8;
  long *in_RDX;
  long *in_RSI;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  sunrealtype *Ydata;
  sunrealtype w;
  sunrealtype v;
  sunrealtype u;
  sunindextype i;
  sunrealtype ep;
  sunindextype N;
  int in_stack_ffffffffffffff9c;
  void *in_stack_ffffffffffffffa8;
  long local_40;
  int local_4;
  
  lVar5 = *in_RDX;
  dVar1 = (double)in_RDX[0xb];
  funcname = (char *)N_VGetArrayPointer(in_RDI);
  iVar7 = check_retval(in_stack_ffffffffffffffa8,funcname,in_stack_ffffffffffffff9c);
  if (iVar7 == 0) {
    for (local_40 = 1; local_40 < lVar5 + -1; local_40 = local_40 + 1) {
      dVar2 = *(double *)(funcname + local_40 * 0x18);
      dVar3 = *(double *)(funcname + local_40 * 0x18 + 8);
      dVar4 = *(double *)(funcname + local_40 * 0x18 + 0x10);
      lVar6 = *(long *)(*(long *)(*in_RSI + 0x40) + local_40 * 0x18);
      *(double *)(lVar6 + *(long *)(*in_RSI + 0x28) * 8) =
           in_XMM0_Qa * (dVar2 * 2.0 * dVar3 + -(dVar4 + 1.0)) +
           *(double *)(lVar6 + *(long *)(*in_RSI + 0x28) * 8);
      lVar6 = *(long *)(*(long *)(*in_RSI + 0x40) + local_40 * 0x18);
      lVar8 = *(long *)(*in_RSI + 0x28) + 1;
      *(double *)(lVar6 + lVar8 * 8) =
           in_XMM0_Qa * (-(dVar2 * 2.0) * dVar3 + dVar4) + *(double *)(lVar6 + lVar8 * 8);
      lVar6 = *(long *)(*(long *)(*in_RSI + 0x40) + local_40 * 0x18);
      lVar8 = *(long *)(*in_RSI + 0x28) + 2;
      *(double *)(lVar6 + lVar8 * 8) = in_XMM0_Qa * -dVar4 + *(double *)(lVar6 + lVar8 * 8);
      lVar6 = *(long *)(*(long *)(*in_RSI + 0x40) + 8 + local_40 * 0x18);
      lVar8 = *(long *)(*in_RSI + 0x28) + -1;
      *(double *)(lVar6 + lVar8 * 8) = in_XMM0_Qa * dVar2 * dVar2 + *(double *)(lVar6 + lVar8 * 8);
      lVar6 = *(long *)(*(long *)(*in_RSI + 0x40) + 8 + local_40 * 0x18);
      *(double *)(lVar6 + *(long *)(*in_RSI + 0x28) * 8) =
           in_XMM0_Qa * -dVar2 * dVar2 + *(double *)(lVar6 + *(long *)(*in_RSI + 0x28) * 8);
      lVar6 = *(long *)(*(long *)(*in_RSI + 0x40) + 0x10 + local_40 * 0x18);
      lVar8 = *(long *)(*in_RSI + 0x28) + -2;
      *(double *)(lVar6 + lVar8 * 8) = in_XMM0_Qa * -dVar2 + *(double *)(lVar6 + lVar8 * 8);
      lVar6 = *(long *)(*(long *)(*in_RSI + 0x40) + 0x10 + local_40 * 0x18);
      lVar8 = *(long *)(*in_RSI + 0x28) + -1;
      *(double *)(lVar6 + lVar8 * 8) = in_XMM0_Qa * dVar2 + *(double *)(lVar6 + lVar8 * 8);
      lVar6 = *(long *)(*(long *)(*in_RSI + 0x40) + 0x10 + local_40 * 0x18);
      *(double *)(lVar6 + *(long *)(*in_RSI + 0x28) * 8) =
           in_XMM0_Qa * (-1.0 / dVar1 - dVar2) + *(double *)(lVar6 + *(long *)(*in_RSI + 0x28) * 8);
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int ReactionJac(sunrealtype c, N_Vector y, SUNMatrix Jac, UserData udata)
{
  sunindextype N = udata->N; /* set shortcuts */
  sunrealtype ep = udata->ep;
  sunindextype i;
  sunrealtype u, v, w;
  sunrealtype* Ydata = N_VGetArrayPointer(y); /* access solution array */
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over nodes, filling in Jacobian of reaction terms */
  for (i = 1; i < N - 1; i++)
  {
    u = Ydata[IDX(i, 0)]; /* set nodal value shortcuts */
    v = Ydata[IDX(i, 1)];
    w = Ydata[IDX(i, 2)];

    /* all vars wrt u */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 0)) += c * (TWO * u * v - (w + ONE));
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 0)) += c * (w - TWO * u * v);
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 0)) += c * (-w);

    /* all vars wrt v */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 1)) += c * (u * u);
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 1)) += c * (-u * u);

    /* all vars wrt w */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 2)) += c * (-u);
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 2)) += c * (u);
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 2)) += c * (-ONE / ep - u);
  }

  /* Return with success */
  return 0;
}